

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# String.hpp
# Opt level: O2

int __thiscall String::compareIgnoreCase(String *this,String *other)

{
  char *pcVar1;
  char *pcVar2;
  long lVar3;
  
  pcVar1 = operator_cast_to_char_(this);
  pcVar2 = operator_cast_to_char_(other);
  lVar3 = 0;
  while( true ) {
    if (lowerCaseMap[(byte)pcVar1[lVar3]] != lowerCaseMap[(byte)pcVar2[lVar3]]) {
      return (uint)(byte)lowerCaseMap[(byte)pcVar1[lVar3]] -
             (uint)(byte)lowerCaseMap[(byte)pcVar2[lVar3]];
    }
    if (pcVar1[lVar3] == 0) break;
    lVar3 = lVar3 + 1;
  }
  return 0;
}

Assistant:

int compareIgnoreCase(const String& other) const
  {
    const char* s1 = *this, * s2 = other;
    char c1, c2;
    for(; (c1 = toLowerCase(*s1)) == (c2 = toLowerCase(*s2)); ++s1, ++s2)
      if(!*s1)
        return 0;
    return (int)(const uchar&)c1 - (const uchar&)c2;
  }